

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolui.c
# Opt level: O2

int ffu2fi1(unsigned_short *input,long ntodo,double scale,double zero,uchar *output,int *status)

{
  long lVar1;
  long lVar2;
  uchar uVar3;
  ushort uVar4;
  double dVar5;
  
  lVar1 = 0;
  if (0 < ntodo) {
    lVar1 = ntodo;
  }
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      dVar5 = ((double)input[lVar2] - zero) / scale;
      if (-0.49 <= dVar5) {
        if (dVar5 <= 255.49) {
          uVar3 = (uchar)(int)(dVar5 + 0.5);
        }
        else {
          *status = -0xb;
          uVar3 = 0xff;
        }
      }
      else {
        *status = -0xb;
        uVar3 = '\0';
      }
      output[lVar2] = uVar3;
    }
  }
  else {
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      uVar4 = input[lVar2];
      if (0xff < uVar4) {
        *status = -0xb;
        uVar4 = 0xff;
      }
      output[lVar2] = (uchar)uVar4;
    }
  }
  return *status;
}

Assistant:

int ffu2fi1(unsigned short *input, /* I - array of values to be converted  */
            long ntodo,            /* I - number of elements in the array  */
            double scale,          /* I - FITS TSCALn or BSCALE value      */
            double zero,           /* I - FITS TZEROn or BZERO  value      */
            unsigned char *output, /* O - output array of converted values */
            int *status)           /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] > UCHAR_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = UCHAR_MAX;
            }
            else
                output[ii] = (unsigned char) input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = ((double) input[ii] - zero) / scale;

            if (dvalue < DUCHAR_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = 0;
            }
            else if (dvalue > DUCHAR_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = UCHAR_MAX;
            }
            else
                output[ii] = (unsigned char) (dvalue + .5);
        }
    }
    return(*status);
}